

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [32];
  short sVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  __m256i *ptr;
  __m256i *palVar8;
  __m256i *ptr_00;
  int16_t *ptr_01;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  int16_t iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  int32_t segNum;
  long lVar21;
  __m256i *palVar22;
  int iVar23;
  ulong size;
  long lVar24;
  bool bVar25;
  undefined2 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  __m256i_16_t e;
  __m256i_16_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar28 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_striped_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar2 = (profile->profile16).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_striped_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_striped_profile_avx2_256_16_cold_6();
      }
      else {
        uVar19 = profile->s1Len;
        if ((int)uVar19 < 1) {
          parasail_nw_striped_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_striped_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_striped_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_striped_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_striped_profile_avx2_256_16_cold_1();
        }
        else {
          iVar6 = uVar19 - 1;
          size = (ulong)uVar19 + 0xf >> 4;
          iVar23 = (int)size;
          iVar15 = -open;
          iVar9 = ppVar3->min;
          iVar11 = -iVar9;
          if (iVar9 != iVar15 && SBORROW4(iVar9,iVar15) == iVar9 + open < 0) {
            iVar11 = open;
          }
          sVar5 = 0x7ffe - (short)ppVar3->max;
          ppVar7 = parasail_result_new();
          if (ppVar7 != (parasail_result_t *)0x0) {
            ppVar7->flag = ppVar7->flag | 0x10200801;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar8 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (palVar8 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
              iVar9 = s2Len + -1;
              iVar10 = 0xf - iVar6 / iVar23;
              uVar26 = (undefined2)open;
              auVar30._2_2_ = uVar26;
              auVar30._0_2_ = uVar26;
              auVar30._4_2_ = uVar26;
              auVar30._6_2_ = uVar26;
              auVar30._8_2_ = uVar26;
              auVar30._10_2_ = uVar26;
              auVar30._12_2_ = uVar26;
              auVar30._14_2_ = uVar26;
              auVar30._16_2_ = uVar26;
              auVar30._18_2_ = uVar26;
              auVar30._20_2_ = uVar26;
              auVar30._22_2_ = uVar26;
              auVar30._24_2_ = uVar26;
              auVar30._26_2_ = uVar26;
              auVar30._28_2_ = uVar26;
              auVar30._30_2_ = uVar26;
              uVar26 = (undefined2)gap;
              auVar31._2_2_ = uVar26;
              auVar31._0_2_ = uVar26;
              auVar31._4_2_ = uVar26;
              auVar31._6_2_ = uVar26;
              auVar31._8_2_ = uVar26;
              auVar31._10_2_ = uVar26;
              auVar31._12_2_ = uVar26;
              auVar31._14_2_ = uVar26;
              auVar31._16_2_ = uVar26;
              auVar31._18_2_ = uVar26;
              auVar31._20_2_ = uVar26;
              auVar31._22_2_ = uVar26;
              auVar31._24_2_ = uVar26;
              auVar31._26_2_ = uVar26;
              auVar31._28_2_ = uVar26;
              auVar31._30_2_ = uVar26;
              auVar27._0_2_ = (undefined2)(iVar11 + -0x7fff);
              auVar27._2_2_ = auVar27._0_2_;
              auVar27._4_2_ = auVar27._0_2_;
              auVar27._6_2_ = auVar27._0_2_;
              auVar27._8_2_ = auVar27._0_2_;
              auVar27._10_2_ = auVar27._0_2_;
              auVar27._12_2_ = auVar27._0_2_;
              auVar27._14_2_ = auVar27._0_2_;
              auVar28._16_2_ = auVar27._0_2_;
              auVar28._0_16_ = auVar27;
              auVar28._18_2_ = auVar27._0_2_;
              auVar28._20_2_ = auVar27._0_2_;
              auVar28._22_2_ = auVar27._0_2_;
              auVar28._24_2_ = auVar27._0_2_;
              auVar28._26_2_ = auVar27._0_2_;
              auVar28._28_2_ = auVar27._0_2_;
              auVar28._30_2_ = auVar27._0_2_;
              auVar29._2_2_ = sVar5;
              auVar29._0_2_ = sVar5;
              auVar29._4_2_ = sVar5;
              auVar29._6_2_ = sVar5;
              auVar29._8_2_ = sVar5;
              auVar29._10_2_ = sVar5;
              auVar29._12_2_ = sVar5;
              auVar29._14_2_ = sVar5;
              auVar29._16_2_ = sVar5;
              auVar29._18_2_ = sVar5;
              auVar29._20_2_ = sVar5;
              auVar29._22_2_ = sVar5;
              auVar29._24_2_ = sVar5;
              auVar29._26_2_ = sVar5;
              auVar29._28_2_ = sVar5;
              auVar29._30_2_ = sVar5;
              lVar16 = (long)iVar15;
              uVar20 = 0;
              do {
                lVar21 = 0;
                lVar17 = lVar16;
                do {
                  uVar26 = 0x8000;
                  if (-0x8000 < lVar17) {
                    uVar26 = (undefined2)lVar17;
                  }
                  *(undefined2 *)((long)&local_80 + lVar21 * 2) = uVar26;
                  lVar24 = lVar17 - (ulong)(uint)open;
                  if (lVar24 < -0x7fff) {
                    lVar24 = -0x8000;
                  }
                  *(short *)((long)&local_a0 + lVar21 * 2) = (short)lVar24;
                  lVar21 = lVar21 + 1;
                  lVar17 = lVar17 - size * (uint)gap;
                } while (lVar21 != 0x10);
                palVar22 = ptr + uVar20;
                (*palVar22)[0] = local_80;
                (*palVar22)[1] = lStack_78;
                (*palVar22)[2] = lStack_70;
                (*palVar22)[3] = lStack_68;
                palVar22 = ptr_00 + uVar20;
                (*palVar22)[0] = local_a0;
                (*palVar22)[1] = lStack_98;
                (*palVar22)[2] = lStack_90;
                (*palVar22)[3] = lStack_88;
                uVar20 = uVar20 + 1;
                lVar16 = lVar16 - (ulong)(uint)gap;
              } while (uVar20 != size);
              *ptr_01 = 0;
              uVar20 = 1;
              do {
                iVar13 = -0x8000;
                if (-0x8000 < iVar15) {
                  iVar13 = (int16_t)iVar15;
                }
                ptr_01[uVar20] = iVar13;
                uVar20 = uVar20 + 1;
                iVar15 = iVar15 - gap;
              } while (s2Len + 1 != uVar20);
              uVar20 = 1;
              if (1 < s2Len) {
                uVar20 = (ulong)(uint)s2Len;
              }
              lVar16 = (ulong)(iVar23 + (uint)(iVar23 == 0)) << 5;
              uVar18 = 0;
              auVar32 = ZEXT3264(auVar28);
              auVar33 = ZEXT3264(auVar29);
              do {
                palVar22 = ptr;
                ptr = palVar8;
                auVar34 = SUB3216(palVar22[iVar23 - 1],0);
                auVar37._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar27;
                auVar37._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar34;
                auVar37 = vpalignr_avx2((undefined1  [32])palVar22[iVar23 - 1],auVar37,0xe);
                iVar11 = ppVar3->mapper[(byte)s2[uVar18]];
                auVar34 = vpinsrw_avx(auVar37._0_16_,(uint)(ushort)ptr_01[uVar18],0);
                auVar37 = vpblendd_avx2(auVar37,ZEXT1632(auVar34),0xf);
                lVar17 = 0;
                auVar36 = ZEXT3264(auVar28);
                do {
                  auVar38 = vpaddsw_avx2(auVar37,*(undefined1 (*) [32])
                                                  ((long)pvVar2 +
                                                  lVar17 + size * (long)iVar11 * 0x20));
                  auVar37 = *(undefined1 (*) [32])((long)*ptr_00 + lVar17);
                  auVar35 = auVar36._0_32_;
                  auVar4 = vpmaxsw_avx2(auVar37,auVar35);
                  auVar38 = vpmaxsw_avx2(auVar4,auVar38);
                  *(undefined1 (*) [32])((long)*ptr + lVar17) = auVar38;
                  auVar4 = vpmaxsw_avx2(auVar32._0_32_,auVar38);
                  auVar32 = ZEXT3264(auVar4);
                  auVar4 = vpminsw_avx2(auVar37,auVar33._0_32_);
                  auVar4 = vpminsw_avx2(auVar4,auVar35);
                  auVar4 = vpminsw_avx2(auVar4,auVar38);
                  auVar33 = ZEXT3264(auVar4);
                  auVar38 = vpsubsw_avx2(auVar38,auVar30);
                  auVar37 = vpsubsw_avx2(auVar37,auVar31);
                  auVar37 = vpmaxsw_avx2(auVar37,auVar38);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar17) = auVar37;
                  auVar37 = vpsubsw_avx2(auVar35,auVar31);
                  auVar37 = vpmaxsw_avx2(auVar37,auVar38);
                  auVar36 = ZEXT3264(auVar37);
                  auVar37 = *(undefined1 (*) [32])((long)*palVar22 + lVar17);
                  lVar17 = lVar17 + 0x20;
                } while (lVar16 != lVar17);
                uVar19 = 0;
                do {
                  iVar11 = ptr_01[uVar18 + 1] - open;
                  if (iVar11 < -0x7fff) {
                    iVar11 = -0x8000;
                  }
                  auVar38._0_16_ = ZEXT116(0) * auVar36._0_16_ + ZEXT116(1) * auVar27;
                  auVar38._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar36._0_16_;
                  auVar37 = vpalignr_avx2(auVar36._0_32_,auVar38,0xe);
                  auVar34 = vpinsrw_avx(auVar37._0_16_,iVar11,0);
                  auVar37 = vpblendd_avx2(auVar37,ZEXT1632(auVar34),0xf);
                  auVar36 = ZEXT3264(auVar37);
                  bVar25 = true;
                  uVar14 = 1;
                  lVar17 = 0;
                  do {
                    auVar37 = vpmaxsw_avx2(auVar36._0_32_,
                                           *(undefined1 (*) [32])((long)*ptr + lVar17));
                    *(undefined1 (*) [32])((long)*ptr + lVar17) = auVar37;
                    auVar4 = vpminsw_avx2(auVar33._0_32_,auVar37);
                    auVar33 = ZEXT3264(auVar4);
                    auVar38 = vpmaxsw_avx2(auVar32._0_32_,auVar37);
                    auVar32 = ZEXT3264(auVar38);
                    auVar37 = vpsubsw_avx2(auVar37,auVar30);
                    auVar35 = vpsubsw_avx2(auVar36._0_32_,auVar31);
                    auVar36 = ZEXT3264(auVar35);
                    auVar37 = vpcmpgtw_avx2(auVar35,auVar37);
                    if ((((((((((((((((((((((((((((((((auVar37 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar37 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar37 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar37 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar37 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar37 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar37 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar37 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar37 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar37 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar37 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar37 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar37 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar37 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar37 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar37 >> 0x7f,0) == '\0')
                                      && (auVar37 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar37 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar37 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar37 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar37 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar37 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar37 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar37 >> 0xbf,0) == '\0') &&
                              (auVar37 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar37 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar37 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar37 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar37 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar37 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar37 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar37[0x1f]) break;
                    bVar25 = uVar14 < size;
                    lVar17 = lVar17 + 0x20;
                    uVar14 = uVar14 + 1;
                  } while (lVar16 != lVar17);
                } while ((!bVar25) && (bVar25 = uVar19 < 0xf, uVar19 = uVar19 + 1, bVar25));
                uVar18 = uVar18 + 1;
                palVar8 = palVar22;
                if (uVar18 == uVar20) {
                  alVar1 = ptr[(uint)(iVar6 % iVar23)];
                  auVar27 = alVar1._16_16_;
                  if (iVar6 / iVar23 < 0xf) {
                    iVar11 = 1;
                    if (1 < iVar10) {
                      iVar11 = iVar10;
                    }
                    do {
                      auVar30 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,
                                                0x28);
                      alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar30,0xe);
                      auVar27 = alVar1._16_16_;
                      iVar11 = iVar11 + -1;
                    } while (iVar11 != 0);
                  }
                  auVar28 = vpcmpgtw_avx2(auVar28,auVar4);
                  auVar29 = vpcmpgtw_avx2(auVar38,auVar29);
                  auVar28 = vpor_avx2(auVar29,auVar28);
                  if ((((((((((((((((((((((((((((((((auVar28 >> 7 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0 &&
                                                   (auVar28 >> 0xf & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar28 >> 0x17 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar28 >> 0x1f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar28 >> 0x27 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar28 >> 0x2f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar28 >> 0x37 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar28 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar28 >> 0x47 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar28 >> 0x4f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar28 >> 0x57 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar28 >> 0x5f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar28 >> 0x67 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar28 >> 0x6f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar28 >> 0x77 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar28 >> 0x7f,0) == '\0')
                                    && (auVar28 >> 0x87 & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                   (auVar28 >> 0x8f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar28 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar28 >> 0x9f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar28 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar28 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar28 >> 0xb7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar28 >> 0xbf,0) == '\0') &&
                            (auVar28 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar28 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar28 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar28 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar28 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar28 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar28 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      -1 < auVar28[0x1f]) {
                    uVar12 = vpextrw_avx(auVar27,7);
                    sVar5 = (short)uVar12;
                  }
                  else {
                    *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
                    sVar5 = 0;
                    iVar9 = 0;
                    iVar6 = 0;
                  }
                  ppVar7->score = (int)sVar5;
                  ppVar7->end_query = iVar6;
                  ppVar7->end_ref = iVar9;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar22);
                  parasail_free(ptr);
                  return ppVar7;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            __m256i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi16_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}